

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> *
embd_to_audio(vector<float,_std::allocator<float>_> *__return_storage_ptr__,float *embd,int n_codes,
             int n_embd,int n_thread)

{
  double dVar1;
  uint uVar2;
  void *__s;
  ulong uVar3;
  vector<float,_std::allocator<float>_> *pvVar4;
  pointer pfVar5;
  int i;
  long lVar6;
  pointer pfVar7;
  undefined4 in_register_00000084;
  ulong n_pad;
  vector<float,_std::allocator<float>_> *in_R9;
  ulong uVar8;
  long lVar9;
  pointer pfVar10;
  size_type __n;
  value_type_conflict5 *__val;
  int iVar11;
  float fVar12;
  vector<float,_std::allocator<float>_> env;
  vector<float,_std::allocator<float>_> *audio;
  vector<float,_std::allocator<float>_> hann;
  vector<float,_std::allocator<float>_> S;
  vector<float,_std::allocator<float>_> hann2;
  vector<float,_std::allocator<float>_> res;
  vector<float,_std::allocator<float>_> ST;
  vector<float,_std::allocator<float>_> E;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  int local_12c;
  int local_128;
  uint local_124;
  float local_120;
  float local_11c;
  long *local_118;
  undefined8 uStack_110;
  long local_108;
  vector<float,_std::allocator<float>_> *local_f8;
  int local_ec;
  void *local_e8;
  void *pvStack_e0;
  long local_d8;
  thread local_c8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  vector<float,_std::allocator<float>_> local_78;
  vector<float,_std::allocator<float>_> local_60;
  vector<std::thread,_std::allocator<std::thread>_> local_48;
  
  n_pad = CONCAT44(in_register_00000084,n_thread);
  local_ec = n_codes * 0x140;
  local_e8 = (void *)0x0;
  pvStack_e0 = (void *)0x0;
  local_d8 = 0;
  local_12c = n_codes;
  local_128 = n_thread;
  local_124 = n_embd;
  local_f8 = __return_storage_ptr__;
  __s = operator_new(0x1400);
  lVar6 = 0;
  local_e8 = __s;
  pvStack_e0 = __s;
  local_d8 = (long)__s + 0x1400;
  memset(__s,0,0x1400);
  pvStack_e0 = (void *)((long)__s + 0x1400);
  do {
    fVar12 = cosf(((float)(int)lVar6 * 6.2831855) / 1280.0);
    *(float *)((long)__s + lVar6 * 4) = (1.0 - fVar12) * 0.5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x500);
  __n = (long)local_12c * (long)(int)local_124;
  std::vector<float,_std::allocator<float>_>::vector(&local_60,__n,(allocator_type *)&local_c0);
  std::vector<float,_std::allocator<float>_>::vector(&local_c0,__n,(allocator_type *)&local_78);
  std::vector<float,_std::allocator<float>_>::vector(&local_78,__n,(allocator_type *)&local_90);
  uVar3 = (ulong)local_12c;
  if (0 < (long)uVar3) {
    n_pad = 0;
    pvVar4 = (vector<float,_std::allocator<float>_> *)
             local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (int)local_124) {
        uVar8 = 0;
        in_R9 = pvVar4;
        do {
          *(float *)&(in_R9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start = embd[uVar8];
          uVar8 = uVar8 + 1;
          in_R9 = (vector<float,_std::allocator<float>_> *)
                  ((long)&(in_R9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar3 * 4);
        } while (local_124 != uVar8);
      }
      n_pad = n_pad + 1;
      embd = embd + local_124;
      pvVar4 = (vector<float,_std::allocator<float>_> *)
               ((long)&(pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start + 4);
    } while (n_pad != uVar3);
  }
  if ((int)local_124 < 2) {
    uVar2 = (int)local_124 / 2;
  }
  else {
    iVar11 = 0;
    do {
      if (0 < local_12c) {
        lVar6 = 0;
        do {
          local_11c = *(float *)((long)&(((_Vector_base<float,_std::allocator<float>_> *)
                                         local_60.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start +
                                (((int)local_124 / 2 + iVar11) * local_12c + lVar6) * 4);
          dVar1 = exp((double)*(float *)((long)&(((_Vector_base<float,_std::allocator<float>_> *)
                                                 local_60.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->_M_impl)
                                                .super__Vector_impl_data._M_start +
                                        (iVar11 * local_12c + lVar6) * 4));
          local_120 = 100.0;
          if ((float)dVar1 <= 100.0) {
            local_120 = (float)dVar1;
          }
          fVar12 = cosf(local_11c);
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[(local_12c * iVar11 + (int)lVar6) * 2] = fVar12 * local_120;
          fVar12 = sinf(local_11c);
          local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start[(local_12c * iVar11 + (int)lVar6) * 2 + 1] = fVar12 * local_120;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < local_12c);
      }
      iVar11 = iVar11 + 1;
      uVar2 = (int)local_124 / 2;
    } while (iVar11 < (int)uVar2);
  }
  lVar6 = (long)local_12c;
  if (0 < lVar6) {
    pfVar7 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    n_pad = (ulong)uVar2;
    pfVar5 = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    in_R9 = (vector<float,_std::allocator<float>_> *)(lVar6 * 8);
    lVar9 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar3 = 0;
        pfVar10 = pfVar5;
        do {
          pfVar7[uVar3 * 2 + -1] = pfVar10[-1];
          pfVar7[uVar3 * 2] = *pfVar10;
          uVar3 = uVar3 + 1;
          pfVar10 = pfVar10 + lVar6 * 2;
        } while (n_pad != uVar3);
      }
      lVar9 = lVar9 + 1;
      pfVar5 = pfVar5 + 2;
      pfVar7 = pfVar7 + (int)local_124;
    } while (lVar9 != lVar6);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_90,lVar6 * 0x500,(allocator_type *)&local_a8);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_a8,(long)local_12c * 0x500,(allocator_type *)&local_48);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&local_48,(long)local_128,(allocator_type *)&local_118);
  if (0 < local_128) {
    lVar6 = 0;
    do {
      local_c8._M_id._M_thread = (id)0;
      local_118 = (long *)operator_new(0x48);
      *local_118 = (long)&PTR___State_0026db80;
      *(int *)(local_118 + 1) = (int)lVar6;
      local_118[2] = (long)&local_12c;
      local_118[3] = (long)&local_128;
      local_118[4] = (long)&local_78;
      local_118[5] = (long)&local_124;
      local_118[6] = (long)&local_90;
      local_118[7] = (long)&local_e8;
      local_118[8] = (long)&local_a8;
      std::thread::_M_start_thread(&local_c8,&local_118,0);
      if (local_118 != (long *)0x0) {
        (**(code **)(*local_118 + 8))();
      }
      if (local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6]._M_id._M_thread != 0) {
        std::terminate();
      }
      local_48.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start[lVar6]._M_id._M_thread =
           (native_handle_type)local_c8._M_id._M_thread;
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_128);
  }
  if (0 < local_128) {
    lVar6 = 0;
    do {
      std::thread::join();
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_128);
  }
  pvVar4 = local_f8;
  uVar2 = local_ec + 0x3c0;
  uVar3 = (ulong)uVar2;
  (local_f8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_f8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_f8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108 = 0;
  local_118 = (long *)0x0;
  uStack_110 = 0;
  fold(&local_90,(long)(int)uVar2,(int64_t)local_f8,uVar3,n_pad,in_R9);
  fold(&local_a8,(long)(int)uVar2,(int64_t)&local_118,uVar3,n_pad,in_R9);
  pfVar5 = (pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(pvVar4->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar5;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 2;
    lVar9 = 0;
    do {
      pfVar5[lVar9] = pfVar5[lVar9] / *(float *)((long)local_118 + lVar9 * 4);
      lVar9 = lVar9 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
  }
  if (local_118 != (long *)0x0) {
    operator_delete(local_118,local_108 - (long)local_118);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_48);
  if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((vector<float,_std::allocator<float>_> *)
      local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (vector<float,_std::allocator<float>_> *)0x0) {
    operator_delete(local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  return pvVar4;
}

Assistant:

static std::vector<float> embd_to_audio(
        const float * embd,
        const int n_codes,
        const int n_embd,
        const int n_thread) {
    const int n_fft = 1280;
    const int n_hop = 320;
    const int n_win = 1280;
    const int n_pad = (n_win - n_hop)/2;
    const int n_out = (n_codes - 1)*n_hop + n_win;

    std::vector<float> hann(n_fft);

    fill_hann_window(hann.size(), true, hann.data());

    int n_spec = n_embd*n_codes;

    std::vector<float> E (n_spec);
    std::vector<float> S (n_spec);
    std::vector<float> ST(n_spec);

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd; ++k) {
            E[k*n_codes + l] = embd[l*n_embd + k];
        }
    }

    for (int k = 0; k < n_embd/2; ++k) {
        for (int l = 0; l < n_codes; ++l) {
            float mag = E[(k           )*n_codes + l];
            float phi = E[(k + n_embd/2)*n_codes + l];

            mag = exp(mag);

            if (mag > 1e2) {
                mag = 1e2;
            }
            S[2*(k*n_codes + l) + 0] = mag*cosf(phi);
            S[2*(k*n_codes + l) + 1] = mag*sinf(phi);
        }
    }

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd/2; ++k) {
            ST[l*n_embd + 2*k + 0] = S[2*(k*n_codes + l) + 0];
            ST[l*n_embd + 2*k + 1] = S[2*(k*n_codes + l) + 1];
        }
    }

    std::vector<float> res  (n_codes*n_fft);
    std::vector<float> hann2(n_codes*n_fft);

    std::vector<std::thread> workers(n_thread);
    for (int i = 0; i < n_thread; ++i) {
        workers[i] = std::thread([&, i]() {
            for (int l = i; l < n_codes; l += n_thread) {
                irfft(n_fft, ST.data() + l*n_embd, res.data() + l*n_fft);
                for (int j = 0; j < n_fft; ++j) {
                    res  [l*n_fft + j] *= hann[j];
                    hann2[l*n_fft + j]  = hann[j] * hann[j];
                }
            }
        });
    }
    for (int i = 0; i < n_thread; ++i) {
        workers[i].join();
    }

    std::vector<float> audio;
    std::vector<float> env;

    fold(res,   n_out, n_win, n_hop, n_pad, audio);
    fold(hann2, n_out, n_win, n_hop, n_pad, env); // TODO: can be done once

    for (size_t i = 0; i < audio.size(); ++i) {
        audio[i] /= env[i];
    }

    return audio;
}